

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[3],kj::StringPtr&,char_const(&)[8],kj::String&,char_const(&)[11]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],StringPtr *params_1,
          char (*params_2) [8],String *params_3,char (*params_4) [11])

{
  char acVar1 [8];
  ArrayPtr<const_char> *params_4_00;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_58 = toCharSequence<char_const(&)[3]>((char (*) [3])this);
  local_68.ptr = *(char **)params;
  local_68.size_ = *(long *)(params[2] + 2) - 1;
  AVar2 = toCharSequence<char_const(&)[8]>((char (*) [8])params_1);
  params_4_00 = (ArrayPtr<const_char> *)AVar2.ptr;
  acVar1 = params_2[1];
  local_38.ptr = (char *)acVar1;
  if (acVar1 != (char  [8])0x0) {
    local_38.ptr = *(char **)params_2;
  }
  local_38.size_ = 0;
  if (acVar1 != (char  [8])0x0) {
    local_38.size_ = (long)acVar1 - 1;
  }
  local_48 = toCharSequence<char_const(&)[11]>((char (*) [11])params_3);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_58,&local_68,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff88,&local_38,&local_48,params_4_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}